

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

CharItem ** __thiscall
Hpipe::Vec<Hpipe::CharItem*>::push_back<Hpipe::CharItem*&>
          (Vec<Hpipe::CharItem*> *this,CharItem **args)

{
  std::vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>>::emplace_back<Hpipe::CharItem*&>
            ((vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>> *)this,args);
  return (CharItem **)(*(long *)(this + 8) + -8);
}

Assistant:

T       *push_back            ( Args &&...args ) { this->emplace_back( std::forward<Args>( args )... ); return &this->back(); }